

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_lemire(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  size_t i;
  long lVar4;
  size_t i_1;
  ulong uVar5;
  size_t i_2;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 local_48 [72];
  
  auVar3 = _DAT_00110680;
  if (len < 0x40) {
    if (len != 0) {
      auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
      auVar9 = vpmovsxbd_avx512f(_DAT_0010f080);
      auVar10 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        auVar11 = vpbroadcastd_avx512f();
        auVar11 = vpsrlvd_avx512f(auVar11,auVar9);
        auVar11 = vpandd_avx512f(auVar11,auVar10);
        auVar8 = vpaddd_avx512f(auVar11,auVar8);
      } while (len != uVar5);
      auVar8 = vmovdqu64_avx512f(auVar8);
      *(undefined1 (*) [64])flags = auVar8;
    }
  }
  else {
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    lVar4 = 1;
    do {
      auVar2 = vpand_avx2(_DAT_00110680,*(undefined1 (*) [32])(local_48 + lVar4 * 2));
      lVar4 = lVar4 + 1;
      auVar2 = vpcmpeqw_avx2(auVar2,_DAT_00110680);
      auVar2 = vpsubw_avx2(auVar8._0_32_,auVar2);
      auVar8 = ZEXT3264(auVar2);
    } while (lVar4 != 0x10);
    uVar5 = (ulong)len;
    lVar4 = 1;
    do {
      auVar2 = vpand_avx2(_DAT_00110680,*(undefined1 (*) [32])(local_48 + lVar4 * 2));
      lVar4 = lVar4 + 1;
      auVar2 = vpcmpeqw_avx2(auVar2,_DAT_00110680);
      auVar2 = vpsubw_avx2(auVar8._0_32_,auVar2);
      auVar8 = ZEXT3264(auVar2);
    } while (lVar4 != 0x10);
    auVar8 = vpmovzxwd_avx512f(auVar2);
    auVar9 = vpaddd_avx512f(auVar8,*(undefined1 (*) [64])flags);
    lVar4 = 0;
    auVar8 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])flags = auVar8;
    do {
      lVar6 = (uVar5 - 0xf) - lVar4;
      if (lVar4 + 0x1000fU < uVar5) {
        lVar6 = 0xffff;
      }
      if (lVar6 == 0) {
        auVar8 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        do {
          auVar2 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + lVar7));
          lVar7 = lVar7 + 1;
          auVar2 = vpcmpeqw_avx2(auVar2,auVar3);
          auVar2 = vpsubw_avx2(auVar8._0_32_,auVar2);
          auVar8 = ZEXT3264(auVar2);
        } while (lVar6 != lVar7);
        auVar8 = vpmovzxwd_avx512f(auVar2);
      }
      uVar1 = lVar6 + 0x10 + lVar4;
      auVar9 = vpaddd_avx512f(auVar9,auVar8);
      lVar4 = lVar4 + lVar6;
      auVar8 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])flags = auVar8;
    } while (uVar1 <= uVar5);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256,
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }
    
    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;
        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}